

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

void Omega_h::correct_momentum_error
               (Mesh *mesh,TransferOpts *xfer_opts,Graph *diffusion_graph,TagBase *tagbase,
               bool verbose)

{
  double dVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  VarCompareOpts opts;
  bool bVar6;
  uint ent_dim;
  Int ncomps;
  LO size_in;
  uint uVar7;
  string *psVar8;
  const_iterator cVar9;
  const_iterator cVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  Int ent_dim_00;
  ulong uVar14;
  long lVar15;
  Int comp;
  ulong uVar16;
  Read<double> elem_errors;
  Reals new_velocities;
  Write<signed_char> local_630;
  Adj local_620;
  int local_5f0;
  Adj local_5e8;
  uint local_5b8;
  Write<signed_char> local_5b0;
  Write<signed_char> local_5a0;
  element_type *local_590;
  Read<double> vert_masses;
  Write<double> out;
  Read<signed_char> all_flags;
  Reals new_elem_momenta;
  Reals elem_velocities;
  Read<double> vert_velocities;
  Reals elem_masses;
  Reals elem_sizes;
  Write<double> local_4d8;
  Write<double> local_4c8;
  Write<double> local_4b8;
  Write<double> local_4a8;
  Write<double> local_498;
  string local_488;
  Write<double> local_468;
  Write<double> local_458;
  Write<double> local_448;
  Write<double> local_438;
  Write<double> local_428;
  Write<double> local_418;
  Read<double> elem_errors_from_density;
  Write<double> local_3f8;
  Write<double> local_3e8;
  Write<double> local_3d8;
  Write<double> local_3c8;
  Write<double> local_3b8;
  Write<double> local_3a8;
  Reals old_elem_momenta;
  Write<double> local_388;
  Write<double> local_378;
  Write<double> local_368;
  Write<double> local_358;
  Reals old_elem_masses;
  Read<double> old_elem_densities;
  Write<double> local_328;
  Write<double> local_318;
  Write<double> local_308;
  Read<double> elem_densities;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> error_name;
  string velocity_name;
  undefined1 local_2a8 [80];
  int local_258;
  Adj local_250;
  uint local_220;
  Write<double> local_218;
  Write<double> local_208;
  VarCompareOpts diffuse_tol;
  Vector<3> v;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> density_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> momentum_name;
  Graph local_180;
  Graph local_160;
  Adj verts2elems;
  type f;
  Adj elems2verts;
  
  ent_dim = Mesh::dim(mesh);
  ncomps = TagBase::ncomps(tagbase);
  psVar8 = TagBase::name_abi_cxx11_(tagbase);
  std::__cxx11::string::string((string *)&velocity_name,(string *)psVar8);
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(xfer_opts->velocity_momentum_map)._M_t,&velocity_name);
  std::__cxx11::string::string((string *)&momentum_name,(string *)(cVar9._M_node + 2));
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(xfer_opts->velocity_density_map)._M_t,&velocity_name);
  std::__cxx11::string::string((string *)&density_name,(string *)(cVar9._M_node + 2));
  std::operator+(&error_name,&momentum_name,"_error");
  ent_dim_00 = (Int)mesh;
  Mesh::get_array<double>((Mesh *)&elem_densities,ent_dim_00,(string *)(ulong)ent_dim);
  Mesh::ask_sizes((Mesh *)&elem_sizes);
  Write<double>::Write(&local_318,&elem_densities.write_);
  Write<double>::Write(&local_328,&elem_sizes.write_);
  std::__cxx11::string::string((string *)&new_velocities,"",(allocator *)local_2a8);
  multiply_each<double>
            ((Omega_h *)&local_308,(Read<double> *)&local_318,(Read<double> *)&local_328,
             (string *)&new_velocities);
  Read<double>::Read((Read<signed_char> *)&elem_masses,&local_308);
  Write<double>::~Write(&local_308);
  std::__cxx11::string::~string((string *)&new_velocities);
  Write<double>::~Write(&local_328);
  Write<double>::~Write(&local_318);
  Mesh::get_array<double>((Mesh *)&vert_velocities,ent_dim_00,(string *)0x0);
  std::__cxx11::string::string((string *)local_2a8,"old_",(allocator *)&f);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &new_velocities,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8,
                 &density_name);
  Mesh::get_array<double>((Mesh *)&old_elem_densities,ent_dim_00,(string *)(ulong)ent_dim);
  std::__cxx11::string::~string((string *)&new_velocities);
  std::__cxx11::string::~string((string *)local_2a8);
  Write<double>::Write(&local_368,&old_elem_densities.write_);
  Write<double>::Write(&local_378,&elem_sizes.write_);
  std::__cxx11::string::string((string *)&new_velocities,"",(allocator *)local_2a8);
  multiply_each<double>
            ((Omega_h *)&local_358,(Read<double> *)&local_368,(Read<double> *)&local_378,
             (string *)&new_velocities);
  Read<double>::Read((Read<signed_char> *)&old_elem_masses,&local_358);
  Write<double>::~Write(&local_358);
  std::__cxx11::string::~string((string *)&new_velocities);
  Write<double>::~Write(&local_378);
  Write<double>::~Write(&local_368);
  Write<double>::Write(&local_388,&vert_velocities.write_);
  average_field((Omega_h *)&elem_velocities,mesh,ent_dim,ncomps,(Reals *)&local_388);
  Write<double>::~Write(&local_388);
  Write<double>::Write(&local_3b8,&elem_velocities.write_);
  Write<double>::Write(&local_3c8,&old_elem_masses.write_);
  std::__cxx11::string::string((string *)&new_velocities,"",(allocator *)local_2a8);
  multiply_each<double>
            ((Omega_h *)&local_3a8,(Read<double> *)&local_3b8,(Read<double> *)&local_3c8,
             (string *)&new_velocities);
  Read<double>::Read((Read<signed_char> *)&old_elem_momenta,&local_3a8);
  Write<double>::~Write(&local_3a8);
  std::__cxx11::string::~string((string *)&new_velocities);
  Write<double>::~Write(&local_3c8);
  Write<double>::~Write(&local_3b8);
  Write<double>::Write(&local_3e8,&elem_velocities.write_);
  Write<double>::Write(&local_3f8,&elem_masses.write_);
  std::__cxx11::string::string((string *)&new_velocities,"",(allocator *)local_2a8);
  multiply_each<double>
            ((Omega_h *)&local_3d8,(Read<double> *)&local_3e8,(Read<double> *)&local_3f8,
             (string *)&new_velocities);
  Read<double>::Read((Read<signed_char> *)&new_elem_momenta,&local_3d8);
  Write<double>::~Write(&local_3d8);
  std::__cxx11::string::~string((string *)&new_velocities);
  Write<double>::~Write(&local_3f8);
  Write<double>::~Write(&local_3e8);
  Write<double>::Write(&local_418,&new_elem_momenta.write_);
  Write<double>::Write(&local_428,&old_elem_momenta.write_);
  subtract_each<double>
            ((Omega_h *)&elem_errors_from_density,(Read<double> *)&local_418,
             (Read<double> *)&local_428);
  Write<double>::~Write(&local_428);
  Write<double>::~Write(&local_418);
  Mesh::ask_up(&verts2elems,mesh,0,ent_dim);
  Graph::Graph(&local_160,&verts2elems.super_Graph);
  Write<double>::Write(&local_438,&elem_masses.write_);
  graph_reduce<double>((Omega_h *)&vert_masses,&local_160,(Read<double> *)&local_438,1,OMEGA_H_SUM);
  Write<double>::~Write(&local_438);
  Graph::~Graph(&local_160);
  Write<double>::Write(&local_448,&vert_masses.write_);
  divide_each_by<double>
            ((Omega_h *)&new_velocities,(Read<double> *)&local_448,(double)(int)(ent_dim + 1));
  Write<double>::operator=(&vert_masses.write_,(Write<signed_char> *)&new_velocities.write_);
  Write<double>::~Write(&new_velocities.write_);
  Write<double>::~Write(&local_448);
  Mesh::ask_down(&elems2verts,mesh,ent_dim,0);
  std::__cxx11::string::string
            ((string *)&new_velocities,"momentum_velocity_fixed",(allocator *)local_2a8);
  bVar6 = Mesh::has_tag(mesh,0,(string *)&new_velocities);
  std::__cxx11::string::~string((string *)&new_velocities);
  if (bVar6) {
    std::__cxx11::string::string
              ((string *)&new_velocities,"momentum_velocity_fixed",(allocator *)local_2a8);
    Mesh::get_array<signed_char>((Mesh *)&all_flags,ent_dim_00,(string *)0x0);
  }
  else {
    size_in = Mesh::nverts(mesh);
    std::__cxx11::string::string((string *)&new_velocities,"",(allocator *)local_2a8);
    Read<signed_char>::Read(&all_flags,size_in,'\0',(string *)&new_velocities);
  }
  std::__cxx11::string::~string((string *)&new_velocities);
  Mesh::get_array<double>((Mesh *)&elem_errors,ent_dim_00,(string *)(ulong)ent_dim);
  Write<double>::Write(&local_458,&elem_errors.write_);
  Write<double>::Write(&local_468,&elem_errors_from_density.write_);
  std::__cxx11::string::string((string *)&new_velocities,"",(allocator *)&f);
  add_each<double>((Omega_h *)local_2a8,(Read<double> *)&local_458,(Read<double> *)&local_468,
                   (string *)&new_velocities);
  Write<double>::operator=(&elem_errors.write_,(Write<signed_char> *)local_2a8);
  Write<double>::~Write((Write<double> *)local_2a8);
  std::__cxx11::string::~string((string *)&new_velocities);
  Write<double>::~Write(&local_468);
  Write<double>::~Write(&local_458);
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Omega_h::VarCompareOpts>_>_>
           ::find(&(xfer_opts->integral_diffuse_map)._M_t,&momentum_name);
  diffuse_tol.floor = (Real)cVar10._M_node[2]._M_left;
  diffuse_tol.type = cVar10._M_node[2]._M_color;
  diffuse_tol._4_4_ = *(undefined4 *)&cVar10._M_node[2].field_0x4;
  diffuse_tol.tolerance = (Real)cVar10._M_node[2]._M_parent;
  Graph::Graph(&local_180,diffusion_graph);
  Write<double>::Write((Write<double> *)&local_488.field_2,&elem_errors.write_);
  Write<double>::Write((Write<double> *)&local_488,&new_elem_momenta.write_);
  opts.tolerance = diffuse_tol.tolerance;
  opts.type = diffuse_tol.type;
  opts._4_4_ = diffuse_tol._4_4_;
  opts.floor = diffuse_tol.floor;
  diffuse_integrals_weighted
            ((Mesh *)&new_velocities,(Graph *)mesh,(Reals *)&local_180,(Reals *)&local_488.field_2,
             opts,&local_488,SUB81(&error_name,0));
  Write<double>::operator=(&elem_errors.write_,(Write<signed_char> *)&new_velocities.write_);
  Write<double>::~Write(&new_velocities.write_);
  Write<double>::~Write((Write<double> *)&local_488);
  Write<double>::~Write((Write<double> *)&local_488.field_2);
  Graph::~Graph(&local_180);
  Write<double>::Write(&local_498,&elem_errors.write_);
  Mesh::set_tag<double>(mesh,ent_dim,&error_name,(Read<double> *)&local_498,false);
  Write<double>::~Write(&local_498);
  Write<double>::Write(&local_4a8,&vert_velocities.write_);
  std::__cxx11::string::string((string *)&new_velocities,"",(allocator *)local_2a8);
  deep_copy<double>((Omega_h *)&out,(Read<signed_char> *)&local_4a8,(string *)&new_velocities);
  std::__cxx11::string::~string((string *)&new_velocities);
  Write<double>::~Write(&local_4a8);
  Write<signed_char>::Write((Write<signed_char> *)&f,&all_flags.write_);
  Write<double>::Write(&f.vert_masses.write_,&vert_masses.write_);
  Adj::Adj(&f.verts2elems,&verts2elems);
  f.dim = ent_dim;
  Adj::Adj(&f.elems2verts,&elems2verts);
  f.ncomps = ncomps;
  Write<double>::Write(&f.out,&out);
  Write<double>::Write(&f.elem_errors.write_,&elem_errors.write_);
  uVar7 = Mesh::nverts(mesh);
  Write<signed_char>::Write((Write<signed_char> *)local_2a8,(Write<signed_char> *)&f);
  Write<double>::Write((Write<double> *)(local_2a8 + 0x10),&f.vert_masses.write_);
  Adj::Adj((Adj *)(local_2a8 + 0x20),&f.verts2elems);
  local_258 = f.dim;
  Adj::Adj(&local_250,&f.elems2verts);
  local_220 = f.ncomps;
  Write<double>::Write(&local_218,&f.out);
  Write<double>::Write(&local_208,&f.elem_errors.write_);
  if (0 < (int)uVar7) {
    entering_parallel = 1;
    Write<signed_char>::Write((Write<signed_char> *)&new_velocities,(Write<signed_char> *)local_2a8)
    ;
    Write<double>::Write(&local_630,(Write<signed_char> *)(local_2a8 + 0x10));
    Adj::Adj(&local_620,(Adj *)(local_2a8 + 0x20));
    local_5f0 = local_258;
    Adj::Adj(&local_5e8,&local_250);
    local_5b8 = local_220;
    Write<double>::Write(&local_5b0,(Write<signed_char> *)&local_218);
    Write<double>::Write(&local_5a0,(Write<signed_char> *)&local_208);
    entering_parallel = 0;
    local_590 = (element_type *)0x0;
    for (uVar12 = 0; uVar12 != uVar7; uVar12 = uVar12 + 1) {
      cVar2 = *(char *)((long)new_velocities.write_.shared_alloc_.direct_ptr + uVar12);
      dVar1 = *(double *)((long)local_630.shared_alloc_.direct_ptr + uVar12 * 8);
      lVar15 = (long)*(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                       *)local_620.super_Graph.a2ab.write_.shared_alloc_.direct_ptr)
                                     ->_M_ptr + uVar12 * 4);
      iVar4 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *)
                              local_620.super_Graph.a2ab.write_.shared_alloc_.direct_ptr)->_M_ptr +
                      uVar12 * 4 + 4);
      uVar13 = 0;
      if (0 < (int)local_5b8) {
        uVar13 = (ulong)local_5b8;
      }
      for (; lVar15 < iVar4; lVar15 = lVar15 + 1) {
        iVar5 = *(int *)((long)&((__shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2> *
                                 )local_620.super_Graph.ab2b.write_.shared_alloc_.direct_ptr)->
                                _M_ptr + lVar15 * 4);
        for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
          v.super_Few<double,_3>.array_[lVar11] = 0.0;
        }
        uVar14 = (ulong)local_5b8;
        if ((int)local_5b8 < 1) {
          uVar14 = 0;
        }
        for (lVar11 = (long)(iVar5 * (int)((long)local_5f0 + 1));
            lVar11 < ((long)iVar5 + 1) * ((long)local_5f0 + 1); lVar11 = lVar11 + 1) {
          cVar3 = *(char *)((long)new_velocities.write_.shared_alloc_.direct_ptr +
                           (long)*(int *)((long)&((
                                                  __shared_ptr<const_Omega_h::TagBase,_(__gnu_cxx::_Lock_policy)2>
                                                  *)local_5e8.super_Graph.ab2b.write_.shared_alloc_.
                                                    direct_ptr)->_M_ptr + lVar11 * 4));
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            if (((uint)(int)cVar3 >> ((uint)uVar16 & 0x1f) & 1) == 0) {
              v.super_Few<double,_3>.array_[uVar16] = v.super_Few<double,_3>.array_[uVar16] + 1.0;
            }
          }
        }
        for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
          if (((uint)(int)cVar2 >> ((uint)uVar14 & 0x1f) & 1) == 0) {
            *(double *)
             ((long)(_func_int ***)local_5b0.shared_alloc_.direct_ptr +
             uVar14 * 8 + (long)(int)local_5b8 * (long)local_590) =
                 *(double *)
                  ((long)(_func_int ***)local_5b0.shared_alloc_.direct_ptr +
                  uVar14 * 8 + (long)(int)local_5b8 * (long)local_590) -
                 (double)((_func_int ***)local_5a0.shared_alloc_.direct_ptr)
                         [(long)(int)(iVar5 * local_5b8) + uVar14] /
                 (v.super_Few<double,_3>.array_[uVar14] * dVar1);
          }
        }
      }
      local_590 = (element_type *)&(local_590->super_Graph).a2ab.write_.shared_alloc_.direct_ptr;
    }
    correct_momentum_error(Omega_h::Mesh*,Omega_h::TransferOpts_const&,Omega_h::Graph,Omega_h::TagBase_const*,bool)
    ::$_0::~__0((__0 *)&new_velocities);
  }
  correct_momentum_error(Omega_h::Mesh*,Omega_h::TransferOpts_const&,Omega_h::Graph,Omega_h::TagBase_const*,bool)
  ::$_0::~__0((__0 *)local_2a8);
  Write<double>::Write(&local_4b8,&out);
  Read<double>::Read((Read<signed_char> *)&new_velocities,&local_4b8);
  Write<double>::~Write(&local_4b8);
  Write<double>::Write(&local_4c8,&new_velocities.write_);
  Mesh::sync_array<double>((Mesh *)local_2a8,ent_dim_00,(Read<double> *)0x0,(Int)&local_4c8);
  Write<double>::operator=(&new_velocities.write_,(Write<signed_char> *)local_2a8);
  Write<double>::~Write((Write<double> *)local_2a8);
  Write<double>::~Write(&local_4c8);
  Write<double>::Write(&local_4d8,&new_velocities.write_);
  Mesh::set_tag<double>(mesh,0,&velocity_name,(Read<double> *)&local_4d8,false);
  Write<double>::~Write(&local_4d8);
  Mesh::remove_tag(mesh,ent_dim,&error_name);
  Write<double>::~Write(&new_velocities.write_);
  correct_momentum_error(Omega_h::Mesh*,Omega_h::TransferOpts_const&,Omega_h::Graph,Omega_h::TagBase_const*,bool)
  ::$_0::~__0((__0 *)&f);
  Write<double>::~Write(&out);
  Write<double>::~Write(&elem_errors.write_);
  Write<signed_char>::~Write(&all_flags.write_);
  Adj::~Adj(&elems2verts);
  Write<double>::~Write(&vert_masses.write_);
  Adj::~Adj(&verts2elems);
  Write<double>::~Write(&elem_errors_from_density.write_);
  Write<double>::~Write(&new_elem_momenta.write_);
  Write<double>::~Write(&old_elem_momenta.write_);
  Write<double>::~Write(&elem_velocities.write_);
  Write<double>::~Write(&old_elem_masses.write_);
  Write<double>::~Write(&old_elem_densities.write_);
  Write<double>::~Write(&vert_velocities.write_);
  Write<double>::~Write(&elem_masses.write_);
  Write<double>::~Write(&elem_sizes.write_);
  Write<double>::~Write(&elem_densities.write_);
  std::__cxx11::string::~string((string *)&error_name);
  std::__cxx11::string::~string((string *)&density_name);
  std::__cxx11::string::~string((string *)&momentum_name);
  std::__cxx11::string::~string((string *)&velocity_name);
  return;
}

Assistant:

void correct_momentum_error(Mesh* mesh, TransferOpts const& xfer_opts,
    Graph diffusion_graph, TagBase const* tagbase, bool verbose) {
  auto dim = mesh->dim();
  auto ncomps = tagbase->ncomps();
  auto velocity_name = tagbase->name();
  auto momentum_name =
      xfer_opts.velocity_momentum_map.find(velocity_name)->second;
  auto density_name =
      xfer_opts.velocity_density_map.find(velocity_name)->second;
  auto error_name = momentum_name + "_error";
  auto elem_densities = mesh->get_array<Real>(dim, density_name);
  auto elem_sizes = mesh->ask_sizes();
  Reals elem_masses = multiply_each(elem_densities, elem_sizes);
  auto vert_velocities = mesh->get_array<Real>(VERT, velocity_name);
  auto old_elem_densities =
      mesh->get_array<Real>(dim, std::string("old_") + density_name);
  Reals old_elem_masses = multiply_each(old_elem_densities, elem_sizes);
  auto elem_velocities = average_field(mesh, dim, ncomps, vert_velocities);
  Reals old_elem_momenta = multiply_each(elem_velocities, old_elem_masses);
  Reals new_elem_momenta = multiply_each(elem_velocities, elem_masses);
  auto elem_errors_from_density =
      subtract_each(new_elem_momenta, old_elem_momenta);
  auto verts2elems = mesh->ask_up(VERT, dim);
  auto vert_masses = graph_reduce(verts2elems, elem_masses, 1, OMEGA_H_SUM);
  vert_masses = divide_each_by(vert_masses, Real(dim + 1));
  auto elems2verts = mesh->ask_down(dim, VERT);
  auto all_flags = get_comps_are_fixed(mesh);
  auto elem_errors = mesh->get_array<Real>(dim, error_name);
  elem_errors = add_each(elem_errors, elem_errors_from_density);
  auto diffuse_tol = xfer_opts.integral_diffuse_map.find(momentum_name)->second;
  elem_errors = diffuse_integrals_weighted(mesh, diffusion_graph, elem_errors,
      new_elem_momenta, diffuse_tol, error_name, verbose);
  mesh->set_tag(dim, error_name, elem_errors);
  auto out = deep_copy(vert_velocities);
  auto f = OMEGA_H_LAMBDA(LO v) {
    auto v_flags = all_flags[v];
    auto v_mass = vert_masses[v];
    for (auto ve = verts2elems.a2ab[v]; ve < verts2elems.a2ab[v + 1]; ++ve) {
      auto e = verts2elems.ab2b[ve];
      auto nfree_verts = zero_vector<3>();
      for (auto ev = e * (dim + 1); ev < (e + 1) * (dim + 1); ++ev) {
        auto v2 = elems2verts.ab2b[ev];
        auto v2_flags = all_flags[v2];
        for (Int comp = 0; comp < ncomps; ++comp) {
          if (!(v2_flags & (1 << comp))) nfree_verts[comp] += 1.0;
        }
      }
      for (Int comp = 0; comp < ncomps; ++comp) {
        if (!(v_flags & (1 << comp))) {
          out[v * ncomps + comp] -=
              elem_errors[e * ncomps + comp] / (nfree_verts[comp] * v_mass);
        }
      }
    }
  };
  parallel_for(mesh->nverts(), f, "correct_momentum_error");
  auto new_velocities = Reals(out);
  new_velocities = mesh->sync_array(VERT, new_velocities, ncomps);
  mesh->set_tag(VERT, velocity_name, new_velocities);
  mesh->remove_tag(dim, error_name);
}